

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::UdpInputPortDeclSyntax::getChild(UdpInputPortDeclSyntax *this,size_t index)

{
  Token token;
  long in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  Info *in_stack_ffffffffffffffa0;
  nullptr_t in_stack_ffffffffffffffa8;
  ConstTokenOrSyntax *in_stack_ffffffffffffffb0;
  
  if (in_RDX == 0) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else if (in_RDX == 1) {
    token.info = in_stack_ffffffffffffffa0;
    token._0_8_ = in_stack_ffffffffffffff98;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x253115,token);
  }
  else if (in_RDX == 2) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x60),in_stack_ffffffffffffff98);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax UdpInputPortDeclSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return &names;
        default: return nullptr;
    }
}